

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

int run_test_tcp_ref2(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t h;
  
  puVar2 = uv_default_loop();
  uv_tcp_init(puVar2,&h);
  uv_listen((uv_stream_t *)&h,0x80,fail_cb);
  uv_unref((uv_handle_t *)&h);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  do_close((uv_stream_t *)&h);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
          ,0xf1,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
  abort();
}

Assistant:

TEST_IMPL(tcp_ref2) {
  uv_tcp_t h;
  uv_tcp_init(uv_default_loop(), &h);
  uv_listen((uv_stream_t*)&h, 128, (uv_connection_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}